

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O2

VaryingStorage * __thiscall
rsg::VaryingStore::getStorage(VaryingStore *this,VariableType *type,char *name)

{
  mapped_type *ppVVar1;
  mapped_type this_00;
  allocator<char> local_49;
  key_type local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
  ppVVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*>_>_>
            ::operator[](&this->m_values,&local_48);
  this_00 = *ppVVar1;
  std::__cxx11::string::~string((string *)&local_48);
  if (this_00 == (mapped_type)0x0) {
    this_00 = (mapped_type)operator_new(0x18);
    VaryingStorage::VaryingStorage(this_00,type,this->m_numVertices);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
    ppVVar1 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*>_>_>
              ::operator[](&this->m_values,&local_48);
    *ppVVar1 = this_00;
    std::__cxx11::string::~string((string *)&local_48);
  }
  return this_00;
}

Assistant:

VaryingStorage* VaryingStore::getStorage (const VariableType& type, const char* name)
{
	VaryingStorage* storage = m_values[name];

	if (!storage)
	{
		storage = new VaryingStorage(type, m_numVertices);
		m_values[name] = storage;
	}

	return storage;
}